

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

kp_error_t kp_cfg_load(kp_ctx *ctx,char *sub)

{
  long lVar1;
  int iVar2;
  kp_error_t kVar3;
  int *piVar4;
  char *pcVar5;
  void *pvVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  char *save_line;
  kp_safe cfg_safe;
  char path [4096];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(path,0,0x1000);
  save_line = (char *)0x0;
  pcVar7 = "/";
  if (*sub == '\0') {
    pcVar7 = "";
  }
  iVar2 = __snprintf_chk(path,0x1000,1,0x1000,"%s%s.config",sub,pcVar7);
  if (iVar2 < 0x1000) {
    kVar3 = kp_safe_init(ctx,&cfg_safe,path);
    if (kVar3 == 0) {
      kVar3 = kp_safe_open(ctx,&cfg_safe,0);
      if (kVar3 == 0) {
        if ((ctx->agent).connected == true) {
          kVar3 = kp_safe_store(ctx,&cfg_safe,0xe10);
          if (kVar3 != 0) goto LAB_00103a57;
        }
        qsort(configs,2,0x20,config_sort);
        while( true ) {
          pcVar7 = strtok_r(cfg_safe.metadata,"\n",&save_line);
          if (pcVar7 == (char *)0x0) break;
          pcVar7 = strtok(pcVar7,":");
          pcVar5 = strtok((char *)0x0,":");
          pvVar6 = bsearch(pcVar7,configs,2,0x20,config_search);
          cfg_safe.metadata = (char *)0x0;
          if (pvVar6 != (void *)0x0) {
            (**(code **)((long)pvVar6 + 0x18))(pvVar6,ctx,pcVar5);
            cfg_safe.metadata = (char *)0x0;
          }
        }
        kVar3 = kp_safe_close(ctx,&cfg_safe);
      }
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0x24;
    kVar3 = 5;
  }
LAB_00103a57:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return kVar3;
  }
  __stack_chk_fail();
}

Assistant:

kp_error_t
kp_cfg_load(struct kp_ctx *ctx, const char *sub)
{
	kp_error_t ret;
	char path[PATH_MAX] = "";
	struct kp_safe cfg_safe;
	char *line = NULL, *save_line = NULL;

	if (snprintf(path, PATH_MAX, "%s%s" KP_CONFIG_SAFE_NAME,
	    sub, strlen(sub) == 0 ? "": "/") >= PATH_MAX) {
		errno = ENAMETOOLONG;
		return KP_ERRNO;
	}

	if ((ret = kp_safe_init(ctx, &cfg_safe, path)) != KP_SUCCESS) {
		return ret;
	}

	if ((ret = kp_safe_open(ctx, &cfg_safe, 0)) != KP_SUCCESS) {
		return ret;
	}

	if (ctx->agent.connected) {
		if ((ret = kp_safe_store(ctx, &cfg_safe, 3600)) != KP_SUCCESS) {
			return ret;
		}
	}

	qsort(configs, N_CONFIG, sizeof(struct config), config_sort);

	line = strtok_r(cfg_safe.metadata, "\n", &save_line);
	while (line != NULL) {
		struct config *config;
		char *key, *value;

		key = strtok(line, ":");
		value = strtok(NULL, ":");

		config = bsearch(key, configs, N_CONFIG, sizeof(struct config), config_search);
		if (config != NULL) {
			config->setter(config, ctx, value);
		}

		line = strtok_r(NULL, "\n", &save_line);
	}

	if ((ret = kp_safe_close(ctx, &cfg_safe)) != KP_SUCCESS) {
		return ret;
	}

	return KP_SUCCESS;
}